

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O1

JsErrorCode
JsGetProxyProperties(JsValueRef object,bool *isProxy,JsValueRef *target,JsValueRef *handler)

{
  ScriptContext *scriptContext;
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  JsErrorCode JVar4;
  JsrtContext *currentContext;
  RecyclableObject *pRVar5;
  JavascriptProxy *this;
  undefined4 *puVar6;
  AutoNestedHandledExceptionType local_68 [2];
  TTDebuggerAbortException anon_var_0;
  Var local_40;
  
  currentContext = JsrtContext::GetCurrent();
  JVar4 = CheckContext(currentContext,false,true);
  if (JVar4 != JsNoError) {
    return JVar4;
  }
  scriptContext =
       (((currentContext->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_68,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  if (object == (JsValueRef)0x0) {
    JVar4 = JsErrorInvalidArgument;
  }
  else {
    local_40 = object;
    if ((ulong)object >> 0x30 == 0) {
      pRVar5 = Js::VarTo<Js::RecyclableObject>(object);
      pSVar1 = (((((pRVar5->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
               scriptContext.ptr;
      if (pSVar1 != scriptContext) {
        JVar4 = JsErrorWrongRuntime;
        if (pSVar1->threadContext != scriptContext->threadContext) goto LAB_003ccdad;
        local_40 = Js::CrossSite::MarshalVar(scriptContext,pRVar5,false);
      }
    }
    if (isProxy == (bool *)0x0) {
      JVar4 = JsErrorNullArgument;
    }
    else {
      if (target != (JsValueRef *)0x0) {
        *target = (JsValueRef)0x0;
      }
      if (handler != (JsValueRef *)0x0) {
        *handler = (JsValueRef)0x0;
      }
      bVar3 = Js::VarIs<Js::JavascriptProxy>(local_40);
      *isProxy = bVar3;
      if (bVar3) {
        this = Js::UnsafeVarTo<Js::JavascriptProxy>(local_40);
        bVar3 = Js::JavascriptProxy::IsRevoked(this);
        if (target != (JsValueRef *)0x0 && !bVar3) {
          pRVar5 = Js::JavascriptProxy::GetTarget(this);
          *target = pRVar5;
        }
        if (handler != (JsValueRef *)0x0 && !bVar3) {
          pRVar5 = Js::JavascriptProxy::GetHandler(this);
          *handler = pRVar5;
        }
      }
      JVar4 = JsNoError;
    }
  }
LAB_003ccdad:
  if ((JVar4 == JsErrorFatal) || (JVar4 == JsErrorNoCurrentContext)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Core/../JsrtInternal.h"
                       ,0x11f,
                       "(errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && (scriptExceptionAllowed || errCode != JsErrorScriptException) && errCode != JsErrorScriptTerminated)"
                       ,
                       "errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && (scriptExceptionAllowed || errCode != JsErrorScriptException) && errCode != JsErrorScriptTerminated"
                      );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_68);
  return JVar4;
}

Assistant:

CHAKRA_API JsGetProxyProperties(_In_ JsValueRef object, _Out_ bool* isProxy, _Out_opt_ JsValueRef* target, _Out_opt_ JsValueRef* handler)
{
    return ContextAPINoScriptWrapper_NoRecord([&](Js::ScriptContext * scriptContext) -> JsErrorCode {
        VALIDATE_INCOMING_REFERENCE(object, scriptContext);
        PARAM_NOT_NULL(isProxy);

        if (target != nullptr)
        {
            *target = JS_INVALID_REFERENCE;
        }

        if (handler != nullptr)
        {
            *handler = JS_INVALID_REFERENCE;
        }

        *isProxy = Js::VarIs<Js::JavascriptProxy>(object);

        if (!*isProxy)
        {
            return JsNoError;
        }

        Js::JavascriptProxy* proxy = Js::UnsafeVarTo<Js::JavascriptProxy>(object);
        bool revoked = proxy->IsRevoked();

        if (target != nullptr && !revoked)
        {
            *target = static_cast<JsValueRef>(proxy->GetTarget());
        }

        if (handler != nullptr && !revoked)
        {
            *handler = static_cast<JsValueRef>(proxy->GetHandler());
        }

        return JsNoError;
    },
        /*allowInObjectBeforeCollectCallback*/true);
}